

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O3

void __thiscall
TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoPoint>_>::Read
          (TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoPoint>_> *this,TPZStream *buf,
          void *context)

{
  TPZGeoEl::Read(&this->super_TPZGeoEl,buf,context);
  pzgeom::TPZGeoPoint::Read(&(this->fGeo).super_TPZGeoPoint,buf,context);
  (*(this->fGeo).fNeighbours[0].super_TPZSavable._vptr_TPZSavable[6])
            ((this->fGeo).fNeighbours,buf,context);
  (**(code **)(*(long *)&(this->fGeo).field_0x30 + 0x30))(&(this->fGeo).field_0x30,buf,context);
  (*this->fNeighbours[0].super_TPZSavable._vptr_TPZSavable[6])(this->fNeighbours,buf,context);
  return;
}

Assistant:

void TPZGeoElRefLess<TGeo>::Read(TPZStream &buf, void *context){
    TPZGeoEl::Read(buf,context);
    fGeo.Read(buf,context);
    for (unsigned int i = 0; i < TGeo::NSides; ++i) {
        this->fNeighbours[i].Read(buf, context);
    }
}